

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::ExeName::set
          (ParserResult *__return_storage_ptr__,ExeName *this,string *newName)

{
  pointer pcVar1;
  element_type *peVar2;
  long lVar3;
  string filename;
  long *local_38 [2];
  long local_28 [2];
  
  lVar3 = ::std::__cxx11::string::find_last_of((char *)newName,0x16a63e,0xffffffffffffffff);
  if (lVar3 == -1) {
    local_38[0] = local_28;
    pcVar1 = (newName->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar1,pcVar1 + newName->_M_string_length);
  }
  else {
    ::std::__cxx11::string::substr((ulong)local_38,(ulong)newName);
  }
  ::std::__cxx11::string::_M_assign
            ((string *)
             (this->m_name).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  peVar2 = (this->m_ref).
           super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00191aa8;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    (*(peVar2->super_BoundRef)._vptr_BoundRef[4])(__return_storage_ptr__,peVar2,local_38);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto set( std::string const& newName ) -> ParserResult {

            auto lastSlash = newName.find_last_of( "\\/" );
            auto filename = ( lastSlash == std::string::npos )
                    ? newName
                    : newName.substr( lastSlash+1 );

            *m_name = filename;
            if( m_ref )
                return m_ref->setValue( filename );
            else
                return ParserResult::ok( ParseResultType::Matched );
        }